

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.c
# Opt level: O1

void nng_stats_dump(nng_stat *stat)

{
  nni_stat_unit nVar1;
  nni_stat_info *pnVar2;
  size_t sVar3;
  nng_stat *stat_00;
  char *pcVar4;
  char *pcVar5;
  char *fmt;
  char *local_30;
  char *scope;
  int len;
  
  pnVar2 = stat->s_info;
  switch(pnVar2->si_type) {
  case NNG_STAT_SCOPE:
    local_30 = nng_stats_dump::buf;
    scope._4_4_ = 0x80;
    stat_sprint_scope(stat,&local_30,(int *)((long)&scope + 4));
    sVar3 = strlen(nng_stats_dump::buf);
    scope._4_4_ = (uint)sVar3;
    if ((0 < (int)scope._4_4_) && (nng_stats_dump::buf[scope._4_4_ - 1] == '.')) {
      scope._4_4_ = scope._4_4_ - 1;
      nng_stats_dump::buf[scope._4_4_] = '\0';
    }
    if (0 < (int)scope._4_4_) {
      nni_plat_printf("\n%s:\n",nng_stats_dump::buf);
    }
    goto LAB_00118ee9;
  case NNG_STAT_LEVEL:
  case NNG_STAT_COUNTER:
    nni_plat_printf("%s%-32s%llu","        ",pnVar2->si_name,(stat->s_val).sv_value);
    nVar1 = stat->s_info->si_unit;
    if (nVar1 == NNG_UNIT_MILLIS) {
      pcVar4 = " ms\n";
    }
    else if (nVar1 == NNG_UNIT_MESSAGES) {
      pcVar4 = " msgs\n";
    }
    else if (nVar1 == NNG_UNIT_BYTES) {
      pcVar4 = " bytes\n";
    }
    else {
      pcVar4 = "\n";
    }
    nni_plat_printf(pcVar4);
    goto LAB_00118ee9;
  case NNG_STAT_STRING:
    pcVar5 = pnVar2->si_name;
    pcVar4 = (char *)(stat->s_val).sv_value;
    fmt = "%s%-32s\"%s\"\n";
    break;
  case NNG_STAT_BOOLEAN:
    pcVar5 = pnVar2->si_name;
    pcVar4 = "false";
    if ((stat->s_val).sv_bool != false) {
      pcVar4 = "true";
    }
    fmt = "%s%-32s%s\n";
    break;
  case NNG_STAT_ID:
    pcVar4 = (char *)(stat->s_val).sv_value;
    pcVar5 = pnVar2->si_name;
    fmt = "%s%-32s%llu\n";
    break;
  default:
    nni_plat_printf("%s%-32s<?>\n","        ",pnVar2->si_name);
    goto LAB_00118ee9;
  }
  nni_plat_printf(fmt,"        ",pcVar5,pcVar4);
LAB_00118ee9:
  for (stat_00 = (nng_stat *)nni_list_first(&stat->s_children); stat_00 != (nng_stat *)0x0;
      stat_00 = (nng_stat *)nni_list_next(&stat->s_children,stat_00)) {
    nng_stats_dump(stat_00);
  }
  return;
}

Assistant:

void
nng_stats_dump(const nng_stat *stat)
{
#ifdef NNG_ENABLE_STATS
	static char        buf[128]; // to minimize recursion, not thread safe
	int                len;
	char              *scope;
	char              *indent = "        ";
	unsigned long long val;
	nni_stat          *child;

	switch (nng_stat_type(stat)) {
	case NNG_STAT_SCOPE:
		scope = buf;
		len   = sizeof(buf);
		stat_sprint_scope(stat, &scope, &len);
		len = (int) strlen(buf);
		if (len > 0) {
			if (buf[len - 1] == '.') {
				buf[--len] = '\0';
			}
		}
		if (len > 0) {
			nni_plat_printf("\n%s:\n", buf);
		}
		break;
	case NNG_STAT_STRING:
		nni_plat_printf("%s%-32s\"%s\"\n", indent, nng_stat_name(stat),
		    nng_stat_string(stat));
		break;
	case NNG_STAT_BOOLEAN:
		nni_plat_printf("%s%-32s%s\n", indent, nng_stat_name(stat),
		    nng_stat_bool(stat) ? "true" : "false");
		break;
	case NNG_STAT_LEVEL:
	case NNG_STAT_COUNTER:
		val = nng_stat_value(stat);
		nni_plat_printf(
		    "%s%-32s%llu", indent, nng_stat_name(stat), val);
		switch (nng_stat_unit(stat)) {
		case NNG_UNIT_BYTES:
			nni_plat_printf(" bytes\n");
			break;
		case NNG_UNIT_MESSAGES:
			nni_plat_printf(" msgs\n");
			break;
		case NNG_UNIT_MILLIS:
			nni_plat_printf(" ms\n");
			break;
		case NNG_UNIT_NONE:
		case NNG_UNIT_EVENTS:
		default:
			nni_plat_printf("\n");
			break;
		}
		break;
	case NNG_STAT_ID:
		val = nng_stat_value(stat);
		nni_plat_printf(
		    "%s%-32s%llu\n", indent, nng_stat_name(stat), val);
		break;
	default:
		nni_plat_printf("%s%-32s<?>\n", indent, nng_stat_name(stat));
		break;
	}

	NNI_LIST_FOREACH (&stat->s_children, child) {
		nng_stats_dump(child);
	}
#else
	NNI_ARG_UNUSED(stat);
#endif
}